

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,string *value)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand
::ValueToString(std::string const& value) const
{
  return value;
}